

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPrivkey
          (ExtPrivkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  DescriptorKeyReference *local_18;
  DescriptorKeyReference *this_local;
  
  local_18 = this;
  this_local = (DescriptorKeyReference *)__return_storage_ptr__;
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey(__return_storage_ptr__,&this->extprivkey_);
    return __return_storage_ptr__;
  }
  local_30.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_30.filename = local_30.filename + 1;
  local_30.line = 0x1a4;
  local_30.funcname = "GetExtPrivkey";
  logger::warn<>(&local_30,"Failed to GetExtPrivkey. unsupported key type.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_50,"GetExtPrivkey unsupported key type.",&local_51);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey DescriptorKeyReference::GetExtPrivkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPrivkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPrivkey unsupported key type.");
}